

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::parseTriple(char **token,int vsize,int vnsize,int vtsize,vertex_index_t *ret)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  undefined8 *in_R8;
  vertex_index_t vi;
  vertex_index_t local_34;
  undefined8 *local_28;
  int local_1c;
  int local_18;
  int local_14;
  long *local_10;
  bool local_1;
  
  if (in_R8 == (undefined8 *)0x0) {
    local_1 = false;
  }
  else {
    local_28 = in_R8;
    local_1c = in_ECX;
    local_18 = in_EDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    vertex_index_t::vertex_index_t(&local_34,-1);
    iVar2 = atoi((char *)*local_10);
    bVar1 = fixIndex(iVar2,local_14,&local_34.v_idx);
    if (bVar1) {
      sVar3 = strcspn((char *)*local_10,"/ \t\r");
      *local_10 = sVar3 + *local_10;
      if (*(char *)*local_10 == '/') {
        *local_10 = *local_10 + 1;
        if (*(char *)*local_10 == '/') {
          *local_10 = *local_10 + 1;
          iVar2 = atoi((char *)*local_10);
          bVar1 = fixIndex(iVar2,local_18,&local_34.vn_idx);
          if (bVar1) {
            sVar3 = strcspn((char *)*local_10,"/ \t\r");
            *local_10 = sVar3 + *local_10;
            *local_28 = local_34._0_8_;
            *(int *)(local_28 + 1) = local_34.vn_idx;
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          iVar2 = atoi((char *)*local_10);
          bVar1 = fixIndex(iVar2,local_1c,&local_34.vt_idx);
          if (bVar1) {
            sVar3 = strcspn((char *)*local_10,"/ \t\r");
            *local_10 = sVar3 + *local_10;
            if (*(char *)*local_10 == '/') {
              *local_10 = *local_10 + 1;
              iVar2 = atoi((char *)*local_10);
              bVar1 = fixIndex(iVar2,local_18,&local_34.vn_idx);
              if (bVar1) {
                sVar3 = strcspn((char *)*local_10,"/ \t\r");
                *local_10 = sVar3 + *local_10;
                *local_28 = local_34._0_8_;
                *(int *)(local_28 + 1) = local_34.vn_idx;
                local_1 = true;
              }
              else {
                local_1 = false;
              }
            }
            else {
              *local_28 = local_34._0_8_;
              *(int *)(local_28 + 1) = local_34.vn_idx;
              local_1 = true;
            }
          }
          else {
            local_1 = false;
          }
        }
      }
      else {
        *local_28 = local_34._0_8_;
        *(int *)(local_28 + 1) = local_34.vn_idx;
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool parseTriple(const char **token, int vsize, int vnsize, int vtsize,
                        vertex_index_t *ret) {
  if (!ret) {
    return false;
  }

  vertex_index_t vi(-1);

  if (!fixIndex(atoi((*token)), vsize, &(vi.v_idx))) {
    return false;
  }

  (*token) += strcspn((*token), "/ \t\r");
  if ((*token)[0] != '/') {
    (*ret) = vi;
    return true;
  }
  (*token)++;

  // i//k
  if ((*token)[0] == '/') {
    (*token)++;
    if (!fixIndex(atoi((*token)), vnsize, &(vi.vn_idx))) {
      return false;
    }
    (*token) += strcspn((*token), "/ \t\r");
    (*ret) = vi;
    return true;
  }

  // i/j/k or i/j
  if (!fixIndex(atoi((*token)), vtsize, &(vi.vt_idx))) {
    return false;
  }

  (*token) += strcspn((*token), "/ \t\r");
  if ((*token)[0] != '/') {
    (*ret) = vi;
    return true;
  }

  // i/j/k
  (*token)++;  // skip '/'
  if (!fixIndex(atoi((*token)), vnsize, &(vi.vn_idx))) {
    return false;
  }
  (*token) += strcspn((*token), "/ \t\r");

  (*ret) = vi;

  return true;
}